

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_substr_compare(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 sVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  jx9_value *pjVar6;
  uint uVar7;
  sxu32 SLen;
  bool bVar8;
  int nSrcLen;
  int nSublen;
  int local_44;
  char *local_40;
  int local_34;
  
  if ((((2 < nArg) && (pcVar4 = jx9_value_to_string(*apArg,&local_44), 0 < local_44)) &&
      (pcVar5 = jx9_value_to_string(apArg[1],&local_34), 0 < local_34)) && (local_34 <= local_44)) {
    pjVar6 = apArg[2];
    local_40 = pcVar5;
    jx9MemObjToInteger(pjVar6);
    uVar2 = *(uint *)&pjVar6->x;
    if ((int)uVar2 < 0) {
      uVar7 = local_44 + uVar2;
      iVar3 = 0;
      if (-1 < (int)uVar7) goto LAB_0013012e;
    }
    else {
      iVar3 = local_44;
      uVar7 = uVar2;
      if ((int)uVar2 < local_44) {
LAB_0013012e:
        bVar8 = true;
        if (nArg == 3) {
          SLen = iVar3 - uVar2;
LAB_00130182:
          if (bVar8) {
            iVar3 = SyStrncmp(pcVar4 + uVar7,local_40,SLen);
          }
          else {
            iVar3 = SyStrnicmp(pcVar4 + uVar7,local_40,SLen);
          }
          pjVar6 = pCtx->pRet;
          jx9MemObjRelease(pjVar6);
          pjVar6->x = (anon_union_8_3_18420de5_for_x)(long)iVar3;
        }
        else {
          pjVar6 = apArg[3];
          jx9MemObjToInteger(pjVar6);
          sVar1 = *(sxu32 *)&pjVar6->x;
          if (0 < (int)sVar1) {
            SLen = local_44 - uVar7;
            if ((int)(uVar7 + sVar1) <= local_44) {
              SLen = sVar1;
            }
            if (nArg < 5) {
              bVar8 = true;
            }
            else {
              pjVar6 = apArg[4];
              jx9MemObjToBool(pjVar6);
              bVar8 = *(int *)&pjVar6->x == 0;
            }
            goto LAB_00130182;
          }
          pjVar6 = pCtx->pRet;
          jx9MemObjRelease(pjVar6);
          (pjVar6->x).rVal = 4.94065645841247e-324;
        }
        uVar2 = 2;
        goto LAB_00130102;
      }
    }
  }
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).rVal = 0.0;
  uVar2 = 8;
LAB_00130102:
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | uVar2;
  return 0;
}

Assistant:

static int jx9Builtin_substr_compare(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zSource, *zOfft, *zSub;
	int nOfft, nLen, nSrcLen, nSublen;
	int iCase = 0;
	int rc;
	if( nArg < 3 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zSource = jx9_value_to_string(apArg[0], &nSrcLen);
	if( nSrcLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = nSrcLen; /* cc warning */
	/* Extract the substring */
	zSub = jx9_value_to_string(apArg[1], &nSublen);
	if( nSublen < 1 || nSublen > nSrcLen){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the offset */
	nOfft = jx9_value_to_int(apArg[2]);
	if( nOfft < 0 ){
		zOfft = &zSource[nSrcLen+nOfft]; 
		if( zOfft < zSource ){
			/* Invalid offset */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nLen = (int)(&zSource[nSrcLen]-zOfft);
		nOfft = (int)(zOfft-zSource);
	}else if( nOfft >= nSrcLen ){
		/* Invalid offset */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}else{
		zOfft = &zSource[nOfft];
		nLen = nSrcLen - nOfft;
	}
	if( nArg > 3 ){
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[3]);
		if( nLen < 1 ){
			/* Invalid  length */
			jx9_result_int(pCtx, 1);
			return JX9_OK;
		}else if( nLen + nOfft > nSrcLen ){
			/* Invalid length */
			nLen = nSrcLen - nOfft;
		}
		if( nArg > 4 ){
			/* Case-sensitive or not */
			iCase = jx9_value_to_bool(apArg[4]);
		}
	}
	/* Perform the comparison */
	if( iCase ){
		rc = SyStrnicmp(zOfft, zSub, (sxu32)nLen);
	}else{
		rc = SyStrncmp(zOfft, zSub, (sxu32)nLen);
	}
	/* Comparison result */
	jx9_result_int(pCtx, rc);
	return JX9_OK;
}